

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O3

bool __thiscall CppGenerator::resortRelation(CppGenerator *this,size_t *rel_id,size_t *view_id)

{
  ulong *puVar1;
  ulong uVar2;
  TDNode *pTVar3;
  size_t *var;
  ulong *puVar4;
  long lVar5;
  
  pTVar3 = TreeDecomposition::getRelation
                     ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,*rel_id);
  puVar4 = this->variableOrder[*view_id].
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = this->variableOrder[*view_id].
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar4 != puVar1) {
    lVar5 = 0;
    do {
      uVar2 = *puVar4;
      if (((pTVar3->_bag).super__Base_bitset<2UL>._M_w[uVar2 >> 6] >> (uVar2 & 0x3f) & 1) != 0) {
        if (this->sortOrders[*rel_id][lVar5] != uVar2) {
          return true;
        }
        lVar5 = lVar5 + 1;
      }
      puVar4 = puVar4 + 1;
    } while (puVar4 != puVar1);
  }
  return false;
}

Assistant:

bool CppGenerator::resortRelation(const size_t& rel_id, const size_t& view_id)
{
    TDNode* rel = _td->getRelation(rel_id);
    
    size_t orderIdx = 0;
    for (const size_t& var : variableOrder[view_id])
    {
        if (rel->_bag[var])
        {
            if (sortOrders[rel_id][orderIdx] != var)
                return true;
            ++orderIdx;
        }
    }
    
    return false;
}